

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_pad(ggml_context *ctx,ggml_tensor *a,int p0,int p1,int p2,int p3)

{
  ggml_tensor *pgVar1;
  ggml_tensor *in_RSI;
  int64_t in_RDI;
  ggml_tensor *result;
  
  pgVar1 = ggml_new_tensor_4d(ctx,a._4_4_,CONCAT44(p0,p1),CONCAT44(p2,p3),(int64_t)result,in_RDI);
  pgVar1->op = GGML_OP_PAD;
  pgVar1->src[0] = in_RSI;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_pad(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   p0,
        int                   p1,
        int                   p2,
        int                   p3) {
    struct ggml_tensor * result = ggml_new_tensor_4d(ctx, a->type,
            a->ne[0] + p0,
            a->ne[1] + p1,
            a->ne[2] + p2,
            a->ne[3] + p3);

    result->op     = GGML_OP_PAD;
    result->src[0] = a;

    return result;
}